

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
* dgrminer::find_maximal_subsets_of_pairs
            (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
            *sets)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  pointer psVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pvVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  _Self __tmp;
  __normal_iterator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_*,_std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>
  __i;
  long lVar15;
  pointer pvVar16;
  pointer pvVar17;
  ulong uVar18;
  bool bVar19;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  vectors;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  bucket;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  newbucked;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  buckets;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  output;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> currentSet;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  testBucket;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> testSet;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_128;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_108;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_e8;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  local_c8;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_a8;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  *local_88;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> local_80;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_68;
  ulong local_50;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> local_48;
  
  local_a8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar4 = (sets->
           super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar9 = (pointer)0x0;
  pvVar17 = (pointer)0x0;
  if ((sets->
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    uVar8 = 0;
    local_88 = __return_storage_ptr__;
    do {
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar4 = psVar4 + uVar8;
      p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
        if (local_108.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_108.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>::
          _M_realloc_insert<dgrminer::int_pair_const&>
                    ((vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>> *)&local_108,
                     (iterator)
                     local_108.
                     super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(int_pair *)(p_Var5 + 1));
        }
        else {
          *(int_pair *)
           local_108.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = *(int_pair *)(p_Var5 + 1);
          local_108.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_108.
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        psVar4 = (sets->
                 super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar8;
      }
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(&local_128,(value_type *)&local_108);
      if (local_108.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar17 = local_128.
                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar9 = local_128.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
      psVar4 = (sets->
               super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)(((long)(sets->
                                    super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)
                            * -0x5555555555555555));
    lVar15 = (long)local_128.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_128.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (lVar15 >> 3) * -0x5555555555555555;
    __return_storage_ptr__ = local_88;
    if (1 < uVar8) {
      if (local_128.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_128.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar1 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                  (local_128.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_128.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                    (pvVar9,pvVar17);
        }
        else {
          pvVar16 = pvVar9 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                    (pvVar9,pvVar16);
          for (; pvVar16 != pvVar17; pvVar16 = pvVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                      (pvVar16);
          }
        }
      }
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_128.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_128.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar14 = (ulong)((long)((local_128.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)((local_128.
                                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3;
        lVar15 = 0;
        uVar8 = 0;
        do {
          uVar18 = *(long *)((long)&((local_128.
                                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + lVar15) -
                   *(long *)((long)&((local_128.
                                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar15) >> 3;
          if (uVar18 == (long)(int)uVar14) {
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::push_back(&local_108,
                        (value_type *)
                        ((long)&((local_128.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar15));
          }
          else {
            std::
            vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
            ::push_back(&local_c8,&local_108);
            local_e8.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_e8.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_e8.
            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::operator=(&local_108,&local_e8);
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::push_back(&local_108,
                        (value_type *)
                        ((long)&((local_128.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar15));
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::~vector(&local_e8);
            uVar14 = uVar18 & 0xffffffff;
          }
          uVar8 = uVar8 + 1;
          lVar15 = lVar15 + 0x18;
        } while (uVar8 < (ulong)(((long)local_128.
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_128.
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
      }
      std::
      vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
      ::push_back(&local_c8,&local_108);
      pvVar9 = ((local_c8.
                 super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((local_c8.
            super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
        lVar15 = 0;
        uVar8 = 0;
        do {
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::push_back(&local_a8,
                      (value_type *)
                      ((long)&(pvVar9->
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar15));
          uVar8 = uVar8 + 1;
          pvVar9 = ((local_c8.
                     super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x18;
        } while (uVar8 < (ulong)(((long)((local_c8.
                                          super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9
                                 >> 3) * -0x5555555555555555));
      }
      if (1 < (ulong)(((long)local_c8.
                             super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c8.
                             super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
      {
        uVar8 = 1;
        do {
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::vector(&local_e8,
                   local_c8.
                   super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8);
          if (local_e8.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_e8.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar14 = 0;
            do {
              std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                        (&local_80,
                         local_e8.
                         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14);
              if (local_80.
                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_80.
                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                bVar3 = true;
                bVar2 = true;
                uVar18 = 0;
                local_50 = uVar14;
                do {
                  std::
                  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  ::vector(&local_68,
                           local_c8.
                           super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar18);
                  if (local_68.
                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      local_68.
                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    uVar14 = 0;
                    do {
                      std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                                (&local_48,
                                 local_68.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar14);
                      if ((long)local_80.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_80.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start != 0) {
                        uVar6 = (long)local_80.
                                      super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_80.
                                      super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3;
                        uVar7 = (long)local_48.
                                      super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3;
                        uVar10 = 0;
                        uVar12 = 0;
                        iVar11 = 0;
LAB_00122f8c:
                        uVar13 = (ulong)(int)uVar12;
                        if (uVar7 <= uVar13) {
                          bVar19 = false;
                          goto LAB_00122fde;
                        }
                        while (local_48.
                               super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13].first <=
                               local_80.
                               super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar10].first) {
                          if (local_80.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10].first ==
                              local_48.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13].first) {
                            if (local_80.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].second <
                                local_48.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].second) break;
                            if (local_80.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].second ==
                                local_48.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].second) {
                              iVar11 = iVar11 + 1;
                              bVar19 = uVar6 == (long)iVar11;
                              bVar2 = bVar3;
                              if (bVar19) {
                                bVar3 = false;
                                bVar2 = false;
                              }
                              goto LAB_00122fdb;
                            }
                          }
                          uVar13 = uVar13 + 1;
                          if (uVar7 <= uVar13) goto code_r0x00122fb6;
                        }
                        goto LAB_00122ff0;
                      }
LAB_00122feb:
                      if (local_48.
                          super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00122ff0:
                        operator_delete(local_48.
                                        super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                    } while ((bVar2) &&
                            (uVar14 = uVar14 + 1,
                            uVar6 = ((long)local_68.
                                           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_68.
                                           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555, uVar14 <= uVar6 && uVar6 - uVar14 != 0));
                  }
                  std::
                  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  ::~vector(&local_68);
                } while ((bVar2) && (uVar18 = uVar18 + 1, uVar18 < uVar8));
                uVar14 = local_50;
                if (bVar2) {
                  std::
                  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  ::push_back(&local_a8,&local_80);
                  uVar14 = local_50;
                }
              }
              if (local_80.
                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_80.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar14 = uVar14 + 1;
              uVar18 = ((long)local_e8.
                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            } while (uVar14 <= uVar18 && uVar18 - uVar14 != 0);
          }
          std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::~vector(&local_e8);
          uVar8 = uVar8 + 1;
          uVar14 = ((long)local_c8.
                          super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.
                          super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        } while (uVar8 <= uVar14 && uVar14 - uVar8 != 0);
      }
      __return_storage_ptr__ = local_88;
      (local_88->
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_a8.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_88->
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_88->
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a8.
           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_108);
      goto LAB_00123108;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = pvVar9;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar17;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00123108:
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
code_r0x00122fb6:
  bVar19 = false;
LAB_00122fdb:
  uVar12 = uVar13 & 0xffffffff;
LAB_00122fde:
  if ((bVar19) || (uVar10 = uVar10 + 1, uVar6 <= uVar10)) goto LAB_00122feb;
  goto LAB_00122f8c;
}

Assistant:

std::vector<std::vector<int_pair>> find_maximal_subsets_of_pairs(std::vector<std::set<int_pair>> sets)
    {
        std::vector<std::vector<int_pair>> output;
        std::vector<std::vector<std::vector<int_pair>>> buckets;

        // transform sets into vectors:
        std::vector<std::vector<int_pair>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int_pair> vec;
            for (std::set<int_pair>::iterator j = sets[i].begin(); j != sets[i].end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        if (vectors.size() <= 1)
        { return vectors; }

        // sort the vector by descending length
        std::sort(vectors.begin(), vectors.end(),
                  [](std::vector<int_pair> x, std::vector<int_pair> y) -> int { return (x.size() > y.size()); });


        int length = vectors[0].size();
        std::vector<std::vector<int_pair>> bucket;//current bucket
        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                std::vector<std::vector<int_pair>> newbucked;
                bucket = newbucked;
                bucket.push_back(vectors[i]);
            }
        }
        buckets.push_back(bucket);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            output.push_back(buckets[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int_pair>> currentBucket = buckets[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int_pair> currentSet = currentBucket[a]; // this set can be potentially added


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int_pair>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int_pair> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet); }
            }//a
        }//i


        return output;
    }